

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  FilePathSpecSyntax *args_2;
  LibraryIncludeStatementSyntax *pLVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = (FilePathSpecSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LibraryIncludeStatementSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::FilePathSpecSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,args_2,&local_50);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LibraryIncludeStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LibraryIncludeStatementSyntax>(
        *deepClone(node.attributes, alloc),
        node.include.deepClone(alloc),
        *deepClone<FilePathSpecSyntax>(*node.filePath, alloc),
        node.semi.deepClone(alloc)
    );
}